

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

void __thiscall NDeviceChannel::~NDeviceChannel(NDeviceChannel *this)

{
  (this->super_NetworkDataType)._vptr_NetworkDataType = (_func_int **)&PTR__NDeviceChannel_002fa550;
  std::__cxx11::string::~string((string *)&this->id);
  return;
}

Assistant:

NDeviceChannel::~NDeviceChannel() {

}